

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O2

GLuint add_shader_file(GLuint p_id,string *p_filepath,string *p_content,ShaderType *p_type)

{
  ShaderFile SStack_a8;
  GLuint local_60 [2];
  ShaderFile local_58;
  
  ShaderFile::ShaderFile(&SStack_a8,p_filepath,p_content,*p_type);
  local_60[0] = p_id;
  ShaderFile::ShaderFile(&local_58,&SStack_a8);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderFile>,std::allocator<std::pair<unsigned_int_const,ShaderFile>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int,ShaderFile>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderFile>,std::allocator<std::pair<unsigned_int_const,ShaderFile>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)ShaderDb::file_map,local_60);
  ShaderFile::~ShaderFile(&local_58);
  ShaderFile::~ShaderFile(&SStack_a8);
  return p_id;
}

Assistant:

GLuint add_shader_file(
    const GLuint p_id,
    const std::string &p_filepath,
    const std::string &p_content,
    const ShaderType &p_type) noexcept
{
    ShaderDb::file_map.emplace(
        std::make_pair(
            p_id,
            ShaderFile(p_filepath,
                       p_content,
                       p_type)));

    return p_id;
}